

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O3

int __thiscall ncnn::Gemm::forward(Gemm *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  allocator_type local_51;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_50;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_38;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&local_38,1,bottom_blob,(allocator_type *)&local_50);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&local_50,1,top_blob,&local_51);
  iVar5 = (*(this->super_Layer)._vptr_Layer[6])(this,&local_38,&local_50,opt);
  if (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != top_blob) {
    piVar1 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar1 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    top_blob->data =
         (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->data;
    top_blob->refcount = piVar1;
    top_blob->elemsize =
         (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->elemsize;
    top_blob->elempack =
         (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->elempack;
    top_blob->allocator =
         (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->allocator;
    iVar2 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->w;
    iVar3 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->h;
    iVar4 = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->d;
    top_blob->dims =
         (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->dims;
    top_blob->w = iVar2;
    top_blob->h = iVar3;
    top_blob->d = iVar4;
    top_blob->c = (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->c;
    top_blob->cstep =
         (local_50.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start)->cstep;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_50);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_38);
  return iVar5;
}

Assistant:

int Gemm::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_blobs(1, bottom_blob);
    std::vector<Mat> top_blobs(1, top_blob);
    int ret = forward(bottom_blobs, top_blobs, opt);
    top_blob = top_blobs[0];
    return ret;
}